

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testDraw
          (FunctionalTest14_15 *this,GLuint routine_configuration,vec4<unsigned_int> *uni_input,
          vec4<unsigned_int> *expected_routine_1_result,
          vec4<unsigned_int> *expected_routine_2_result)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  uint *puVar4;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *this_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  bool local_392;
  bool local_391;
  undefined1 local_388 [8];
  MessageBuilder message;
  MessageBuilder local_1f8;
  undefined1 local_78 [8];
  vec4<unsigned_int> routine_2_result;
  vec4<unsigned_int> routine_1_result;
  GLuint *feedback_data;
  uint local_48;
  GLuint location;
  GLuint i;
  GLuint subroutine_indices [2];
  bool result;
  Functions *gl;
  vec4<unsigned_int> *expected_routine_2_result_local;
  vec4<unsigned_int> *expected_routine_1_result_local;
  vec4<unsigned_int> *uni_input_local;
  GLuint routine_configuration_local;
  FunctionalTest14_15 *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar1);
  subroutine_indices[0]._3_1_ = 1;
  (**(code **)(register0x00000000 + 0x15c0))
            (this->m_uniform_location,uni_input->m_x,uni_input->m_y,uni_input->m_z,uni_input->m_w);
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e9a);
  for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
    (&location)[this->m_subroutine_uniform_locations[local_48]] =
         this->m_subroutine_indices[local_48][routine_configuration];
  }
  (**(code **)(stack0xffffffffffffffc8 + 0x1668))(0x8b31,2,&location);
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ea6);
  (**(code **)(stack0xffffffffffffffc8 + 0x30))(0);
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eaa);
  (**(code **)(stack0xffffffffffffffc8 + 0x538))(0,0,1);
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ead);
  (**(code **)(stack0xffffffffffffffc8 + 0x638))();
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eb0);
  puVar4 = (uint *)(**(code **)(stack0xffffffffffffffc8 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eb4);
  Utils::vec4<unsigned_int>::vec4((vec4<unsigned_int> *)&routine_2_result.m_z);
  Utils::vec4<unsigned_int>::vec4((vec4<unsigned_int> *)local_78);
  routine_2_result.m_z = *puVar4;
  routine_2_result.m_w = puVar4[1];
  local_78._0_4_ = puVar4[4];
  local_78._4_4_ = puVar4[5];
  routine_2_result.m_x = puVar4[6];
  routine_2_result.m_y = puVar4[7];
  (**(code **)(stack0xffffffffffffffc8 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(stack0xffffffffffffffc8 + 0x800))();
  glu::checkError(dVar2,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ec5);
  local_391 = false;
  if ((subroutine_indices[0]._3_1_ & 1) != 0) {
    local_391 = Utils::vec4<unsigned_int>::operator==
                          ((vec4<unsigned_int> *)&routine_2_result.m_z,expected_routine_1_result);
  }
  subroutine_indices[0]._3_1_ = local_391;
  local_392 = false;
  if (local_391 != false) {
    local_392 = Utils::vec4<unsigned_int>::operator==
                          ((vec4<unsigned_int> *)local_78,expected_routine_2_result);
  }
  subroutine_indices[0]._3_1_ = local_392;
  if (local_392 == false) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1f8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [23])"Error. Invalid result.");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_388,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_388,(char (*) [20])"Routine_1, result: ");
    Utils::vec4<unsigned_int>::log((vec4<unsigned_int> *)&routine_2_result.m_z,__x);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_388,(char (*) [13])0x2a22899);
    Utils::vec4<unsigned_int>::log(expected_routine_1_result,__x_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_388,(char (*) [20])"Routine_2, result: ");
    Utils::vec4<unsigned_int>::log((vec4<unsigned_int> *)local_78,__x_01);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_388,(char (*) [13])0x2a22899);
    Utils::vec4<unsigned_int>::log(expected_routine_2_result,__x_02);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_388,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_388);
  }
  return (bool)(subroutine_indices[0]._3_1_ & 1);
}

Assistant:

bool FunctionalTest14_15::testDraw(glw::GLuint routine_configuration, const Utils::vec4<glw::GLuint>& uni_input,
								   const Utils::vec4<glw::GLuint>& expected_routine_1_result,
								   const Utils::vec4<glw::GLuint>& expected_routine_2_result) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;
	GLuint				  subroutine_indices[2];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Set up input data uniforms */
	gl.uniform4ui(m_uniform_location, uni_input.m_x, uni_input.m_y, uni_input.m_z, uni_input.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];

		subroutine_indices[location] = m_subroutine_indices[i][routine_configuration];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLuint* feedback_data = (GLuint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLuint> routine_1_result;
	Utils::vec4<GLuint> routine_2_result;

	routine_1_result.m_x = feedback_data[0 + 0];
	routine_1_result.m_y = feedback_data[0 + 1];
	routine_1_result.m_z = feedback_data[0 + 2];
	routine_1_result.m_w = feedback_data[0 + 3];

	routine_2_result.m_x = feedback_data[4 + 0];
	routine_2_result.m_y = feedback_data[4 + 1];
	routine_2_result.m_z = feedback_data[4 + 2];
	routine_2_result.m_w = feedback_data[4 + 3];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verifiy */
	result = result && (routine_1_result == expected_routine_1_result);
	result = result && (routine_2_result == expected_routine_2_result);

	/* Log error if any */
	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Routine_1, result: ";

		routine_1_result.log(message);

		message << ", expected: ";

		expected_routine_1_result.log(message);

		message << "Routine_2, result: ";

		routine_2_result.log(message);

		message << ", expected: ";

		expected_routine_2_result.log(message);

		message << tcu::TestLog::EndMessage;
	}

	/* Done */
	return result;
}